

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECI.cpp
# Opt level: O2

ECI ZXing::ToECI(CharacterSet cs)

{
  _Rb_tree_node_base *p_Var1;
  ECI EVar2;
  int iVar3;
  undefined7 in_register_00000039;
  
  iVar3 = (int)CONCAT71(in_register_00000039,cs);
  if (iVar3 == 2) {
    EVar2 = ISO8859_1;
  }
  else if (iVar3 == 0x11) {
    EVar2 = Cp437;
  }
  else {
    EVar2 = Unknown;
    for (p_Var1 = (_Rb_tree_node_base *)ECI_TO_CHARSET._24_8_;
        p_Var1 != (_Rb_tree_node_base *)(ECI_TO_CHARSET + 8);
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      if (p_Var1[1].field_0x4 == cs) {
        return p_Var1[1]._M_color;
      }
    }
  }
  return EVar2;
}

Assistant:

ECI ToECI(CharacterSet cs)
{
	// Special case ISO8859_1 to avoid obsolete ECI 1
	if (cs == CharacterSet::ISO8859_1)
		return ECI::ISO8859_1;
	// Special case Cp437 to avoid obsolete ECI 0 for slightly less obsolete ECI 2
	if (cs == CharacterSet::Cp437)
		return ECI::Cp437;

	for (auto& [key, value] : ECI_TO_CHARSET)
		if (value == cs)
			return key;

	return ECI::Unknown;
}